

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O0

void __thiscall QMessageDialogOptions::removeButton(QMessageDialogOptions *this,int id)

{
  int in_ESI;
  CustomButton *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  QList<QMessageDialogOptions::CustomButton> *this_00;
  QString *label;
  int id_00;
  QString local_48;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QList<QMessageDialogOptions::CustomButton> *)((in_RDI->label).d.d + 7);
  label = &local_48;
  id_00 = in_ESI;
  QString::QString((QString *)0x3b8ae7);
  CustomButton::CustomButton(in_RDI,id_00,label,(ButtonRole)((ulong)local_30 >> 0x20),this_00);
  QList<QMessageDialogOptions::CustomButton>::removeOne<QMessageDialogOptions::CustomButton>
            (this_00,(CustomButton *)CONCAT44(in_ESI,in_stack_ffffffffffffff88));
  CustomButton::~CustomButton((CustomButton *)0x3b8b22);
  QString::~QString((QString *)0x3b8b2c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageDialogOptions::removeButton(int id)
{
    d->customButtons.removeOne(CustomButton(id));
}